

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *targetDir,string *dependFile,
          string *internalDependFile,DependencyMap *validDeps)

{
  cmMakefile *this_00;
  _Alloc_hider this_01;
  bool bVar1;
  bool bVar2;
  Encoding EVar3;
  string *psVar4;
  cmValue topBinary;
  ostream *poVar5;
  pointer __lhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  DependencyMap *local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string *local_540;
  string local_538;
  cmList langs;
  cmGeneratedFileStream ruleFileStream;
  cmGeneratedFileStream internalRuleFileStream;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[44]>
            ((string *)&ruleFileStream,psVar4,
             (char (*) [44])"/CMakeFiles/CMakeDirectoryInformation.cmake");
  bVar1 = cmMakefile::ReadListFile(this_00,(string *)&ruleFileStream);
  if (bVar1) {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    std::__cxx11::string::~string((string *)&ruleFileStream);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_FORCE_UNIX_PATHS",(allocator<char> *)&local_560);
      internalRuleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream =
           (_func_int **)cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (internalRuleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream != (_func_int **)0x0) {
        bVar1 = cmValue::IsOff((cmValue *)&internalRuleFileStream);
        if (!bVar1) {
          cmSystemTools::s_ForceUnixPaths = true;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_RELATIVE_PATH_TOP_SOURCE",
                 (allocator<char> *)&internalRuleFileStream);
      local_540 = (string *)cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_RELATIVE_PATH_TOP_BINARY",
                 (allocator<char> *)&internalRuleFileStream);
      topBinary = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (topBinary.Value != (string *)0x0 && local_540 != (string *)0x0) {
        cmOutputConverter::SetRelativePathTop((cmOutputConverter *)this,local_540,topBinary.Value);
      }
      goto LAB_0053614b;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&ruleFileStream);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ruleFileStream,"Directory Information file not found",
             (allocator<char> *)&internalRuleFileStream);
  cmSystemTools::Error((string *)&ruleFileStream);
  std::__cxx11::string::~string((string *)&ruleFileStream);
LAB_0053614b:
  EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream(&ruleFileStream,dependFile,false,EVar3);
  cmGeneratedFileStream::SetCopyIfDifferent(&ruleFileStream,true);
  if (((&ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              (&internalRuleFileStream,internalDependFile,false,EVar3);
    bVar1 = ((&internalRuleFileStream.super_ofstream.
               super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)internalRuleFileStream.super_ofstream.
                    super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
            == 0;
    if (bVar1) {
      WriteDisclaimer(this,(ostream *)&ruleFileStream);
      WriteDisclaimer(this,(ostream *)&internalRuleFileStream);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"CMAKE_DEPENDS_LANGUAGES",(allocator<char> *)&local_568);
      psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_538);
      std::__cxx11::string::string((string *)&local_560,(string *)psVar4);
      init._M_len = 1;
      init._M_array = &local_560;
      cmList::cmList(&langs,init);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_538);
      for (__lhs = langs.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __lhs != langs.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
        bVar2 = std::operator==(__lhs,"C");
        if (bVar2) {
LAB_00536313:
          local_568 = validDeps;
          local_538._M_dataplus._M_p = (pointer)this;
          std::
          make_unique<cmDependsC,cmLocalUnixMakefileGenerator3*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>*>
                    ((cmLocalUnixMakefileGenerator3 **)&local_560,&local_538,targetDir,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      **)__lhs);
LAB_00536337:
          this_01._M_p = local_560._M_dataplus._M_p;
          if ((cmDepends *)local_560._M_dataplus._M_p != (cmDepends *)0x0) {
            *(cmLocalUnixMakefileGenerator3 **)(local_560._M_dataplus._M_p + 8) = this;
            *(cmFileTimeCache **)(local_560._M_dataplus._M_p + 0x18) =
                 (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                  CMakeInstance->FileTimeCache)._M_t.
                 super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
                 super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
                 super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
            std::__cxx11::string::_M_assign((string *)(local_560._M_dataplus._M_p + 0x20));
            std::__cxx11::string::_M_assign((string *)(this_01._M_p + 0x40));
            cmDepends::Write((cmDepends *)this_01._M_p,(ostream *)&ruleFileStream,
                             (ostream *)&internalRuleFileStream);
            (**(code **)(*(long *)this_01._M_p + 8))(this_01._M_p);
          }
        }
        else {
          bVar2 = std::operator==(__lhs,"CXX");
          if (bVar2) goto LAB_00536313;
          bVar2 = std::operator==(__lhs,"RC");
          if (bVar2) goto LAB_00536313;
          bVar2 = std::operator==(__lhs,"ASM");
          if (bVar2) goto LAB_00536313;
          bVar2 = std::operator==(__lhs,"OBJC");
          if (bVar2) goto LAB_00536313;
          bVar2 = std::operator==(__lhs,"OBJCXX");
          if (bVar2) goto LAB_00536313;
          bVar2 = std::operator==(__lhs,"CUDA");
          if (bVar2) goto LAB_00536313;
          bVar2 = std::operator==(__lhs,"HIP");
          if (bVar2) goto LAB_00536313;
          bVar2 = std::operator==(__lhs,"ISPC");
          if (bVar2) goto LAB_00536313;
          bVar2 = std::operator==(__lhs,"Fortran");
          if (bVar2) {
            poVar5 = std::operator<<((ostream *)&ruleFileStream,
                                     "# Note that incremental build could trigger ");
            std::operator<<(poVar5,"a call to cmake_copy_f90_mod on each re-build\n");
            local_538._M_dataplus._M_p = (pointer)this;
            std::make_unique<cmDependsFortran,cmLocalUnixMakefileGenerator3*>
                      ((cmLocalUnixMakefileGenerator3 **)&local_560);
            goto LAB_00536337;
          }
          bVar2 = std::operator==(__lhs,"Java");
          if (bVar2) {
            std::make_unique<cmDependsJava>();
            goto LAB_00536337;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&langs.Values);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&internalRuleFileStream);
  }
  else {
    bVar1 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ruleFileStream);
  return bVar1;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  std::string const& targetDir, std::string const& dependFile,
  std::string const& internalDependFile, cmDepends::DependencyMap& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  {
    std::string dirInfoFile =
      cmStrCat(this->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeDirectoryInformation.cmake");
    if (mf->ReadListFile(dirInfoFile) &&
        !cmSystemTools::GetErrorOccurredFlag()) {
      haveDirectoryInfo = true;
    }
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (cmValue force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!force.IsOff()) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    cmValue relativePathTopSource =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE");
    cmValue relativePathTopBinary =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY");
    if (relativePathTopSource && relativePathTopBinary) {
      this->SetRelativePathTop(*relativePathTopSource, *relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  cmGeneratedFileStream ruleFileStream(
    dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  cmGeneratedFileStream internalRuleFileStream(
    internalDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  cmList langs{ mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES") };
  for (std::string const& lang : langs) {
    // construct the checker
    // Create the scanner for this language
    std::unique_ptr<cmDepends> scanner;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "OBJC" || lang == "OBJCXX" || lang == "CUDA" ||
        lang == "HIP" || lang == "ISPC") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = cm::make_unique<cmDependsC>(this, targetDir, lang, &validDeps);
    }
#ifndef CMAKE_BOOTSTRAP
    else if (lang == "Fortran") {
      ruleFileStream << "# Note that incremental build could trigger "
                     << "a call to cmake_copy_f90_mod on each re-build\n";
      scanner = cm::make_unique<cmDependsFortran>(this);
    } else if (lang == "Java") {
      scanner = cm::make_unique<cmDependsJava>();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileTimeCache(
        this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(targetDir);
      scanner->Write(ruleFileStream, internalRuleFileStream);
    }
  }

  return true;
}